

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
array<CEnvelope_*,_allocator_default<CEnvelope_*>_>::clear
          (array<CEnvelope_*,_allocator_default<CEnvelope_*>_> *this)

{
  CEnvelope *pCVar1;
  CEnvelope **in_RDI;
  
  allocator_default<CEnvelope_*>::free_array(in_RDI);
  *(undefined4 *)(in_RDI + 1) = 1;
  pCVar1 = (CEnvelope *)allocator_default<CEnvelope_*>::alloc_array(0);
  *in_RDI = pCVar1;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}